

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void tmvline4_addclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar4 = dc_dest;
  iVar6 = dc_count;
  do {
    lVar9 = 0;
    lVar8 = 0;
    pbVar10 = pbVar4;
    do {
      uVar5 = *(uint *)((long)vplce + lVar8);
      uVar7 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar9) +
                              (ulong)(uVar5 >> ((byte)iVar3 & 0x3f)));
      if (uVar7 != 0) {
        uVar5 = pDVar2[*pbVar10] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar7)]
                & 0x40100400;
        uVar5 = uVar5 - (uVar5 >> 5) |
                pDVar2[*pbVar10] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar7)]
                & 0x3e0f83e0 | 0x1f07c1f;
        *pbVar10 = RGB32k.All[uVar5 >> 0xf & uVar5];
        uVar5 = *(uint *)((long)vplce + lVar8);
      }
      *(uint *)((long)vplce + lVar8) = uVar5 + *(int *)((long)vince + lVar8);
      lVar8 = lVar8 + 4;
      pbVar10 = pbVar10 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar8 != 0x10);
    pbVar4 = pbVar4 + dc_pitch;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void tmvline4_addclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = fg2rgb[palookupoffse[i][pix]] + bg2rgb[dest[i]];
				DWORD b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}